

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O2

void __thiscall iu_Optional_x_iutest_x_PrintTo_Test::Body(iu_Optional_x_iutest_x_PrintTo_Test *this)

{
  optional<int> *v;
  optional<int> *v_00;
  optional<int> opt;
  iuCodeMessage local_248;
  string local_218;
  string local_1f8;
  PrintToLogChecker ck;
  iuStreamMessage local_190;
  
  PrintToLogChecker::PrintToLogChecker(&ck,"1234");
  opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload.
  _M_value = 0x4d2;
  opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_engaged
       = true;
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::PrintToString<std::optional<int>>(&local_1f8,(iutest *)&opt,v);
  iutest::detail::iuStreamMessage::operator<<(&local_190,&local_1f8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0x65,"Succeeded.\n");
  local_248._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1f8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  PrintToLogChecker::~PrintToLogChecker(&ck);
  PrintToLogChecker::PrintToLogChecker(&ck,"nullopt");
  opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_engaged
       = false;
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::PrintToString<std::optional<int>>(&local_218,(iutest *)&opt,v_00);
  iutest::detail::iuStreamMessage::operator<<(&local_190,&local_218);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0x6a,"Succeeded.\n");
  local_248._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_218);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  PrintToLogChecker::~PrintToLogChecker(&ck);
  return;
}

Assistant:

IUTEST(Optional, PrintTo)
{
    {
        PrintToLogChecker ck("1234");
        ::std::optional<int> opt = 1234;
        IUTEST_SUCCEED() << ::iutest::PrintToString(opt);
    }
    {
        PrintToLogChecker ck("nullopt");
        ::std::optional<int> opt = ::std::nullopt;
        IUTEST_SUCCEED() << ::iutest::PrintToString(opt);
    }
}